

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# miniaudio.h
# Opt level: O1

size_t ma_wav_dr_callback__read(void *pUserData,void *pBufferOut,size_t bytesToRead)

{
  size_t bytesRead;
  size_t local_10;
  
  (**(code **)((long)pUserData + 0x48))
            (*(undefined8 *)((long)pUserData + 0x60),pBufferOut,bytesToRead,&local_10);
  return local_10;
}

Assistant:

static size_t ma_wav_dr_callback__read(void* pUserData, void* pBufferOut, size_t bytesToRead)
{
    ma_wav* pWav = (ma_wav*)pUserData;
    ma_result result;
    size_t bytesRead;

    MA_ASSERT(pWav != NULL);

    result = pWav->onRead(pWav->pReadSeekTellUserData, pBufferOut, bytesToRead, &bytesRead);
    (void)result;

    return bytesRead;
}